

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O1

IPAsKeyLRU * __thiscall IPAsKeyLRU::CreateCopy(IPAsKeyLRU *this)

{
  ulong uVar1;
  IPAsKeyLRU *pIVar2;
  size_t __n;
  
  pIVar2 = (IPAsKeyLRU *)operator_new(0x48);
  uVar1 = (this->super_IPAsKey).addr_len;
  (pIVar2->super_IPAsKey)._vptr_IPAsKey = (_func_int **)&PTR__IPAsKeyLRU_001ac520;
  (pIVar2->super_IPAsKey).HashNext = (IPAsKey *)0x0;
  (pIVar2->super_IPAsKey).count = 1;
  (pIVar2->super_IPAsKey).hash = 0;
  __n = 0x10;
  if (uVar1 < 0x10) {
    __n = uVar1;
  }
  memcpy((pIVar2->super_IPAsKey).addr,(this->super_IPAsKey).addr,__n);
  (pIVar2->super_IPAsKey).addr_len = __n;
  (pIVar2->super_IPAsKey)._vptr_IPAsKey = (_func_int **)&PTR__IPAsKeyLRU_001ac550;
  pIVar2->MoreRecentKey = (IPAsKeyLRU *)0x0;
  pIVar2->LessRecentKey = (IPAsKeyLRU *)0x0;
  (pIVar2->super_IPAsKey).count = (this->super_IPAsKey).count;
  (pIVar2->super_IPAsKey).hash = (this->super_IPAsKey).hash;
  return pIVar2;
}

Assistant:

IPAsKeyLRU * IPAsKeyLRU::CreateCopy()
{
    IPAsKeyLRU * x = new IPAsKeyLRU(addr, addr_len);

    if (x != NULL)
    {
        x->count = count;
        x->hash = hash;
    }

    return x;
}